

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

Calendar * __thiscall icu_63::Calendar::operator=(Calendar *this,Calendar *right)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  int32_t *piVar4;
  int32_t *piVar5;
  
  if (this != right) {
    piVar4 = right->fFields;
    piVar5 = this->fFields;
    for (lVar3 = 0x17; lVar3 != 0; lVar3 = lVar3 + -1) {
      *piVar5 = *piVar4;
      piVar4 = piVar4 + 1;
      piVar5 = piVar5 + 1;
    }
    *(undefined8 *)(this->fIsSet + 0xf) = *(undefined8 *)(right->fIsSet + 0xf);
    uVar1 = *(undefined8 *)(right->fIsSet + 8);
    *(undefined8 *)this->fIsSet = *(undefined8 *)right->fIsSet;
    *(undefined8 *)(this->fIsSet + 8) = uVar1;
    piVar4 = right->fStamp;
    piVar5 = this->fStamp;
    for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)piVar5 = *(undefined8 *)piVar4;
      piVar4 = piVar4 + 2;
      piVar5 = piVar5 + 2;
    }
    this->fStamp[0x16] = right->fStamp[0x16];
    this->fTime = right->fTime;
    this->fIsTimeSet = right->fIsTimeSet;
    this->fAreAllFieldsSet = right->fAreAllFieldsSet;
    this->fAreFieldsSet = right->fAreFieldsSet;
    this->fAreFieldsVirtuallySet = right->fAreFieldsVirtuallySet;
    this->fLenient = right->fLenient;
    this->fRepeatedWallTime = right->fRepeatedWallTime;
    this->fSkippedWallTime = right->fSkippedWallTime;
    if (this->fZone != (TimeZone *)0x0) {
      (*(this->fZone->super_UObject)._vptr_UObject[1])();
    }
    this->fZone = (TimeZone *)0x0;
    if (right->fZone != (TimeZone *)0x0) {
      iVar2 = (*(right->fZone->super_UObject)._vptr_UObject[0xc])();
      this->fZone = (TimeZone *)CONCAT44(extraout_var,iVar2);
    }
    this->fFirstDayOfWeek = right->fFirstDayOfWeek;
    this->fMinimalDaysInFirstWeek = right->fMinimalDaysInFirstWeek;
    this->fWeekendOnset = right->fWeekendOnset;
    this->fWeekendOnsetMillis = right->fWeekendOnsetMillis;
    this->fWeekendCease = right->fWeekendCease;
    this->fWeekendCeaseMillis = right->fWeekendCeaseMillis;
    this->fNextStamp = right->fNextStamp;
    strncpy(this->validLocale,right->validLocale,0x9d);
    strncpy(this->actualLocale,right->actualLocale,0x9d);
    this->validLocale[0x9c] = '\0';
    this->actualLocale[0x9c] = '\0';
  }
  return this;
}

Assistant:

Calendar &
Calendar::operator=(const Calendar &right)
{
    if (this != &right) {
        uprv_arrayCopy(right.fFields, fFields, UCAL_FIELD_COUNT);
        uprv_arrayCopy(right.fIsSet, fIsSet, UCAL_FIELD_COUNT);
        uprv_arrayCopy(right.fStamp, fStamp, UCAL_FIELD_COUNT);
        fTime                    = right.fTime;
        fIsTimeSet               = right.fIsTimeSet;
        fAreAllFieldsSet         = right.fAreAllFieldsSet;
        fAreFieldsSet            = right.fAreFieldsSet;
        fAreFieldsVirtuallySet   = right.fAreFieldsVirtuallySet;
        fLenient                 = right.fLenient;
        fRepeatedWallTime        = right.fRepeatedWallTime;
        fSkippedWallTime         = right.fSkippedWallTime;
        delete fZone;
        fZone = NULL;
        if (right.fZone != NULL) {
            fZone                = right.fZone->clone();
        }
        fFirstDayOfWeek          = right.fFirstDayOfWeek;
        fMinimalDaysInFirstWeek  = right.fMinimalDaysInFirstWeek;
        fWeekendOnset            = right.fWeekendOnset;
        fWeekendOnsetMillis      = right.fWeekendOnsetMillis;
        fWeekendCease            = right.fWeekendCease;
        fWeekendCeaseMillis      = right.fWeekendCeaseMillis;
        fNextStamp               = right.fNextStamp;
        uprv_strncpy(validLocale, right.validLocale, sizeof(validLocale));
        uprv_strncpy(actualLocale, right.actualLocale, sizeof(actualLocale));
        validLocale[sizeof(validLocale)-1] = 0;
        actualLocale[sizeof(validLocale)-1] = 0;
    }

    return *this;
}